

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O1

uint8_t cueify_full_toc_get_session_sub_q_channel_format
                  (cueify_full_toc *t,uint8_t session,uint8_t point)

{
  uint8_t *puVar1;
  
  if (((t != (cueify_full_toc *)0x0) && (*(byte *)t <= session)) &&
     (session <= *(byte *)((long)t + 1))) {
    if (point == 0xaa) {
      puVar1 = (uint8_t *)((long)t + (ulong)session * 0x20 + (ulong)session + 0x38f);
    }
    else if (point == 0xa1) {
      puVar1 = (uint8_t *)((long)t + (ulong)session * 0x20 + (ulong)session + 0x3a1);
    }
    else {
      if (point != 0xa0) {
        return '\0';
      }
      puVar1 = (uint8_t *)((long)t + (ulong)session * 0x20 + (ulong)session + 0x398);
    }
    return *puVar1;
  }
  return '\0';
}

Assistant:

uint8_t cueify_full_toc_get_session_sub_q_channel_format(cueify_full_toc *t,
							 uint8_t session,
							 uint8_t point) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	switch (point) {
	case CUEIFY_FULL_TOC_FIRST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[1].adr;
	case CUEIFY_FULL_TOC_LAST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[2].adr;
	case CUEIFY_LEAD_OUT_TRACK:
	    return toc->sessions[session].pseudotracks[0].adr;
	default:
	    return 0;
	}
    } else {
	return 0;
    }
}